

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExamResults * InferExamAnswers::Parser::getExamResults(istream *inputStream)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  invalid_argument *piVar5;
  char *pcVar6;
  istream *in_RSI;
  ExamResults *in_RDI;
  uint8_t j;
  string_type bitString;
  int rawScore;
  stringstream ss_3;
  size_t i;
  valarray<unsigned_char> examScores;
  valarray<unsigned_long> studentAnswers;
  regex questionRegex;
  stringstream ss_2;
  stringstream ss_1;
  int rawQuestionCount;
  int rawStudentCount;
  stringstream ss;
  string inputLine;
  uint8_t questionCount;
  uint8_t studentCount;
  smatch match;
  string *in_stack_fffffffffffff698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a0;
  ExamResults *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff6b0;
  undefined7 in_stack_fffffffffffff6b8;
  _Alloc_hider in_stack_fffffffffffff6bf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  undefined8 in_stack_fffffffffffff6d0;
  flag_type __f;
  undefined4 in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffff6e0;
  byte local_859;
  string local_858 [32];
  string local_838 [32];
  int local_818;
  undefined1 local_811;
  stringstream local_7f0 [16];
  ostream local_7e0 [376];
  ulong local_668;
  valarray<unsigned_char> local_660;
  valarray<unsigned_long> local_650;
  string local_640 [32];
  string local_620 [32];
  string local_600 [71];
  undefined1 local_5b9;
  string local_5b8 [32];
  stringstream local_598 [16];
  ostream local_588 [383];
  undefined1 local_409;
  string local_408 [32];
  stringstream local_3e8 [16];
  ostream local_3d8 [376];
  string local_260 [36];
  int local_23c;
  string local_238 [32];
  int local_218;
  undefined1 local_211;
  stringstream local_1f0 [16];
  ostream local_1e0 [376];
  string local_68 [38];
  byte local_42;
  byte local_41;
  istream *local_10;
  
  __f = (flag_type)((ulong)in_stack_fffffffffffff6d0 >> 0x20);
  local_10 = in_RSI;
  if (getExamResults(std::istream&)::countRegex_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&getExamResults(std::istream&)::countRegex_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_fffffffffffff6e0,
                 (char *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),__f);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &getExamResults(std::istream&)::countRegex_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getExamResults(std::istream&)::countRegex_abi_cxx11_);
    }
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffff6a0);
  local_41 = 0;
  local_42 = 0;
  std::__cxx11::string::string(local_68);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_68);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (in_stack_fffffffffffff6c0,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
                     in_stack_fffffffffffff6b0,
                     (match_flag_type)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    poVar3 = std::operator<<(local_1e0,
                             "Expected input of the form of \"p q\" where p is the number of ");
    poVar3 = std::operator<<(poVar3,"students and q is the number of questions. Got: \"");
    poVar3 = std::operator<<(poVar3,local_68);
    std::operator<<(poVar3,"\"");
    local_211 = 1;
    uVar4 = __cxa_allocate_exception(0x18);
    std::__cxx11::stringstream::str();
    ParserError::ParserError((ParserError *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    local_211 = 0;
    __cxa_throw(uVar4,&ParserError::typeinfo,ParserError::~ParserError);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffff6a0,(size_t *)in_stack_fffffffffffff698,0);
  std::__cxx11::string::~string(local_238);
  local_218 = iVar2;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
  iVar2 = std::__cxx11::stoi(in_stack_fffffffffffff6a0,(size_t *)in_stack_fffffffffffff698,0);
  std::__cxx11::string::~string(local_260);
  local_23c = iVar2;
  if (0xc < local_218) {
    std::__cxx11::stringstream::stringstream(local_3e8);
    poVar3 = std::operator<<(local_3d8,"A maximum of ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    std::operator<<(poVar3," students are supported.");
    local_409 = 1;
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::invalid_argument::invalid_argument(piVar5,local_408);
    local_409 = 0;
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (0x28 < iVar2) {
    std::__cxx11::stringstream::stringstream(local_598);
    poVar3 = std::operator<<(local_588,"A maximum of ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x28);
    std::operator<<(poVar3," questions are supported.");
    local_5b9 = 1;
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::invalid_argument::invalid_argument(piVar5,local_5b8);
    local_5b9 = 0;
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_41 = (byte)local_218;
  local_23c._0_1_ = (byte)iVar2;
  local_42 = (byte)local_23c;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
  std::operator+((char *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
  std::operator+(in_stack_fffffffffffff6a8,(char *)in_stack_fffffffffffff6a0);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            (in_stack_fffffffffffff6e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),__f);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_640);
  std::valarray<unsigned_long>::valarray
            ((valarray<unsigned_long> *)in_stack_fffffffffffff6a0,(size_t)in_stack_fffffffffffff698)
  ;
  std::valarray<unsigned_char>::valarray
            ((valarray<unsigned_char> *)in_stack_fffffffffffff6a0,(size_t)in_stack_fffffffffffff698)
  ;
  local_668 = 0;
  while( true ) {
    if (local_41 <= local_668) {
      this = in_RDI;
      std::valarray<unsigned_long>::valarray
                (&in_RDI->answers,(valarray<unsigned_long> *)in_stack_fffffffffffff698);
      std::valarray<unsigned_char>::valarray
                ((valarray<unsigned_char> *)this,
                 (valarray<unsigned_char> *)in_stack_fffffffffffff698);
      in_RDI->questionCount = local_42;
      in_RDI->studentCount = local_41;
      std::valarray<unsigned_char>::~valarray((valarray<unsigned_char> *)this);
      std::valarray<unsigned_long>::~valarray(&this->answers);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)0x107d32);
      return in_RDI;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_68);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (in_stack_fffffffffffff6c0,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff6bf,in_stack_fffffffffffff6b8),
                       in_stack_fffffffffffff6b0,
                       (match_flag_type)((ulong)in_stack_fffffffffffff6a8 >> 0x20));
    if (!bVar1) break;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    in_stack_fffffffffffff6dc =
         std::__cxx11::stoi(in_stack_fffffffffffff6a0,(size_t *)in_stack_fffffffffffff698,0);
    std::__cxx11::string::~string(local_838);
    local_818 = in_stack_fffffffffffff6dc;
    if ((int)(uint)local_42 < in_stack_fffffffffffff6dc) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar5,"Score is higher then the number of questions.");
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffff6b0,(size_type)in_stack_fffffffffffff6a8);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    in_stack_fffffffffffff6bf = local_818._0_1_;
    in_stack_fffffffffffff6c0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::valarray<unsigned_char>::operator[](&local_660,local_668);
    in_stack_fffffffffffff6c0->_M_dataplus = in_stack_fffffffffffff6bf;
    for (local_859 = 0; local_859 < local_42; local_859 = local_859 + 1) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_858);
      if (*pcVar6 == '1') {
        in_stack_fffffffffffff6a8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)(1 << ((local_42 - local_859) - 1 & 0x1f));
        in_stack_fffffffffffff6b0 =
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             std::valarray<unsigned_long>::operator[](&local_650,local_668);
        *(ulong *)in_stack_fffffffffffff6b0 =
             (ulong)in_stack_fffffffffffff6a8 | *(ulong *)in_stack_fffffffffffff6b0;
      }
    }
    std::__cxx11::string::~string(local_858);
    local_668 = local_668 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_7f0);
  poVar3 = std::operator<<(local_7e0,"Expected answers in the form a_1a_2...a_q <score>. Got: \"");
  poVar3 = std::operator<<(poVar3,local_68);
  std::operator<<(poVar3,"\"");
  local_811 = 1;
  uVar4 = __cxa_allocate_exception(0x18);
  std::__cxx11::stringstream::str();
  ParserError::ParserError((ParserError *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  local_811 = 0;
  __cxa_throw(uVar4,&ParserError::typeinfo,ParserError::~ParserError);
}

Assistant:

ExamResults Parser::getExamResults(std::istream& inputStream)
{
	static const auto maxStudent = 12;
	static const auto maxQuestion = 40;
	static const std::regex countRegex(R"(\s*(\d+)\s+(\d+))");

	std::smatch match;

	uint8_t studentCount = 0;
	uint8_t questionCount = 0;

	std::string inputLine;
	std::getline(inputStream, inputLine);

	if (!std::regex_match(inputLine, match, countRegex)) {
		std::stringstream ss;
		ss << R"(Expected input of the form of "p q" where p is the number of )"
		   << R"(students and q is the number of questions. Got: ")" << inputLine << "\"";
		throw ParserError(ss.str());
	}

	const auto rawStudentCount = std::stoi(match[1].str());
	const auto rawQuestionCount = std::stoi(match[2].str());
	if (rawStudentCount > maxStudent) {
		std::stringstream ss;
		ss << "A maximum of " << maxStudent << " students are supported.";
		throw std::invalid_argument(ss.str());
	}

	if (rawQuestionCount > maxQuestion) {
		std::stringstream ss;
		ss << "A maximum of " << maxQuestion << " questions are supported.";
		throw std::invalid_argument(ss.str());
	}

	studentCount = static_cast<uint8_t>(rawStudentCount);
	questionCount = static_cast<uint8_t>(rawQuestionCount);

	const std::regex questionRegex(R"(\s*([0|1]{)" + match[2].str() + R"(})\s*(\d+))");

	std::valarray<uint64_t> studentAnswers(studentCount);
	std::valarray<uint8_t> examScores(studentCount);

	for (size_t i = 0; i < studentCount; ++i) {
		std::getline(inputStream, inputLine);
		if (!std::regex_match(inputLine, match, questionRegex)) {
			std::stringstream ss;
			ss << R"(Expected answers in the form a_1a_2...a_q <score>. Got: ")" << inputLine << "\"";
			throw ParserError(ss.str());
		}

		const auto rawScore = std::stoi(match[2].str());
		if (rawScore > questionCount) {
			throw std::invalid_argument("Score is higher then the number of questions.");
		}

		const auto bitString = match[1].str();

		examScores[i] = static_cast<uint8_t>(rawScore);
		for (uint8_t j = 0; j < questionCount; ++j) {
			if (bitString[j] == '1') {
				studentAnswers[i] |= 1U << (questionCount - j - 1U);
			}
		}
	}

	return ExamResults{studentAnswers, examScores, questionCount, studentCount};
}